

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::Read<tcu::Vector<int,4>>
          (BasicAllFormatsLoadStoreComputeStage *this,GLenum internalformat,Vector<int,_4> *value,
          Vector<int,_4> *expected_value,GLenum format,GLenum type)

{
  CallLogWrapper *this_00;
  ulong uVar1;
  _Alloc_hider _Var2;
  Vector<int,_4> *pVVar3;
  _func_int **pp_Var4;
  GLuint program;
  GLuint program_00;
  ostream *poVar5;
  pointer pVVar6;
  void *__s;
  int *piVar7;
  int *piVar8;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  Vector<int,_4> *extraout_RDX;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  GLenum format_00;
  undefined4 in_register_00000084;
  int *piVar9;
  undefined4 in_register_0000008c;
  ulong uVar10;
  bool bVar11;
  string local_2e8;
  string local_2c8;
  void *local_2a8;
  undefined8 local_2a0;
  Vector<int,_4> *local_298;
  GLuint m_buffer;
  undefined8 local_288;
  undefined2 local_280;
  undefined6 uStack_27e;
  string local_270;
  GLuint texture [2];
  undefined2 local_240;
  undefined6 uStack_23e;
  ShortByteData<tcu::Vector<int,_4>_> d;
  string local_1e8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ostringstream os;
  
  local_2a8 = (void *)CONCAT44(in_register_0000008c,type);
  local_2a0 = CONCAT44(in_register_00000084,format);
  local_298 = expected_value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&os,
             "\n#define KSIZE 8\nlayout(local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout(",
             0x4f);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            ((string *)&d,(ShaderImageLoadStoreBase *)(ulong)internalformat,e);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      (char *)d.data.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                      (long)d.data.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", binding = 2) readonly uniform ",0x20)
  ;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_2c8._M_string_length = 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_2c8._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"image2D g_image_read;\nlayout(",0x1d);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2e8,(ShaderImageLoadStoreBase *)(ulong)internalformat,e_00);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,", binding = 3) writeonly uniform ",0x21);
  local_280 = 0x69;
  local_288 = 1;
  _m_buffer = (char *)&local_280;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_280,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "image2D g_image_write;\nvoid main() {\n  ivec2 coord = ivec2(gl_LocalInvocationID);\n  "
             ,0x54);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  local_270.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_270._M_string_length = 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_270._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "vec4 v = imageLoad(g_image_read, coord);\n  imageStore(g_image_write, coord, v+v);\n  //imageStore(g_image_write, coord, "
             ,0x77);
  local_240 = 0x69;
  texture = (GLuint  [2])&local_240;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_240,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"vec4",4);
  poVar5 = tcu::operator<<(poVar5,local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n}",4);
  if (texture != (GLuint  [2])&local_240) {
    operator_delete((void *)texture,CONCAT62(uStack_23e,local_240) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT62(local_270.field_2._M_allocated_capacity._2_6_,
                             local_270.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (_m_buffer != (char *)&local_280) {
    operator_delete(_m_buffer,CONCAT62(uStack_27e,local_280) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT62(local_2e8.field_2._M_allocated_capacity._2_6_,
                             local_2e8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT62(local_2c8.field_2._M_allocated_capacity._2_6_,
                             local_2c8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (d.data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&d.data.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(d.data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(d.data.
                                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                      ((ShaderImageLoadStoreBase *)this,&local_1e8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  format_00 = (GLenum)local_2a0;
  glcts::anon_unknown_0::ShortByteData<tcu::Vector<int,_4>_>::ShortByteData
            (&d,8,value,internalformat,format_00);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,2,texture);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,8,8);
  pVVar6 = (pointer)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  if ((int)internalformat < 0x8d88) {
    if (((internalformat == 0x8058) ||
        (pVVar6 = (pointer)d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_start, internalformat == 0x8d76)) ||
       (pVVar6 = (pointer)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start, internalformat == 0x8d7c))
    goto LAB_00c5215b;
  }
  else if (((internalformat == 0x8f97) || (internalformat == 0x8d8e)) ||
          (pVVar6 = (pointer)d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start, internalformat == 0x8d88))
  goto LAB_00c5215b;
  pVVar6 = d.data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
LAB_00c5215b:
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0,0,8,8,format_00,(GLenum)local_2a8,pVVar6);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,8,8);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,texture[0],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,texture[1],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[1]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "\n#define KSIZE 8\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nuniform ",
             0x51);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_2c8._M_string_length = 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_2c8._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"sampler2D g_sampler;\nlayout(std430) buffer OutputBuffer {\n  ",0x3c);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_2e8._M_string_length = 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_2e8._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  data[gl_LocalInvocationIndex] = texelFetch(g_sampler, ivec2(gl_LocalInvocationID), 0);\n  //data[gl_LocalInvocationIndex] = "
             ,0xa6);
  local_280 = 0x69;
  local_288 = 1;
  _m_buffer = (char *)&local_280;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_280,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"vec4",4);
  poVar5 = tcu::operator<<(poVar5,local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n}",3);
  if (_m_buffer != (char *)&local_280) {
    operator_delete(_m_buffer,CONCAT62(uStack_27e,local_280) + 1);
  }
  pVVar3 = local_298;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT62(local_2e8.field_2._M_allocated_capacity._2_6_,
                             local_2e8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT62(local_2c8.field_2._M_allocated_capacity._2_6_,
                             local_2c8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program_00 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                         ((ShaderImageLoadStoreBase *)this,&local_270,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT62(local_270.field_2._M_allocated_capacity._2_6_,
                             local_270.field_2._M_allocated_capacity._0_2_) + 1);
  }
  __s = operator_new(0x400);
  memset(__s,0,0x400);
  local_2a8 = __s;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x400,__s,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,program_00);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  local_2a0 = CONCAT44(local_2a0._4_4_,program_00);
  piVar7 = (int *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x400,1);
  if (*piVar7 == pVVar3->m_data[0]) {
    v = (Vector<int,_4> *)(ulong)(uint)pVVar3->m_data[1];
    bVar11 = false;
    piVar9 = piVar7;
    uVar10 = 0;
    do {
      piVar8 = piVar7 + uVar10 * 4;
      if (((piVar9[1] != pVVar3->m_data[1]) || (piVar9[2] != pVVar3->m_data[2])) ||
         (piVar8 = piVar9, piVar9[3] != pVVar3->m_data[3])) goto LAB_00c5258a;
      uVar1 = uVar10 + 1;
      bVar11 = 0x3e < uVar10;
      if (uVar10 == 0x3f) {
        glu::CallLogWrapper::glDeleteTextures(this_00,2,texture);
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glDeleteProgram(this_00,program);
        glu::CallLogWrapper::glDeleteProgram(this_00,(GLuint)local_2a0);
        bVar11 = true;
        glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
        goto LAB_00c5269a;
      }
      piVar8 = piVar9 + 4;
      piVar9 = piVar9 + 4;
      uVar10 = uVar1;
    } while (*piVar8 == pVVar3->m_data[0]);
    piVar8 = piVar7 + uVar1 * 4;
  }
  else {
    bVar11 = false;
    piVar8 = piVar7;
    v = extraout_RDX;
    uVar10 = 0;
  }
LAB_00c5258a:
  local_1b8 = *(undefined8 *)piVar8;
  uStack_1b0 = *(undefined8 *)(piVar8 + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
            ((string *)&os,(ShaderImageLoadStoreBase *)&local_1b8,v);
  pp_Var4 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  local_1c8 = *(undefined8 *)pVVar3->m_data;
  uStack_1c0 = *(undefined8 *)(pVVar3->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
            (&local_2c8,(ShaderImageLoadStoreBase *)&local_1c8,v_00);
  _Var2._M_p = local_2c8._M_dataplus._M_p;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2e8,(ShaderImageLoadStoreBase *)(ulong)internalformat,e_01);
  glcts::anon_unknown_0::Output
            ("[%d] Value is: %s. Value should be: %s. Format is: %s.\n",uVar10 & 0xffffffff,pp_Var4,
             _Var2._M_p,local_2e8._M_dataplus._M_p);
  __s = local_2a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT62(local_2e8.field_2._M_allocated_capacity._2_6_,
                             local_2e8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT62(local_2c8.field_2._M_allocated_capacity._2_6_,
                             local_2c8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,2,texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  glu::CallLogWrapper::glDeleteProgram(this_00,(GLuint)local_2a0);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
LAB_00c5269a:
  operator_delete(__s,0x400);
  if (d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (d.data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(d.data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)d.data.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)d.data.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar11;
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value, GLenum format, GLenum type)
	{
		GLuint program = CreateComputeProgram(GenCS(internalformat, expected_value));

		const int		 kSize = 8;
		ShortByteData<T> d(kSize, value, internalformat, format);
		GLuint			 texture[2];
		glGenTextures(2, texture);

		/* read texture */
		{
			glBindTexture(GL_TEXTURE_2D, texture[0]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
			if (Shorts(internalformat))
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datas[0]);
			else if (Bytes(internalformat))
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datab[0]);
			else
				glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.data[0]);
		}
		/* write texture */
		{
			glBindTexture(GL_TEXTURE_2D, texture[1]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);

		glBindImageTexture(2, texture[0], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, texture[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glDispatchCompute(1, 1, 1);

		glBindTexture(GL_TEXTURE_2D, texture[1]);
		glMemoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

		GLuint		   c_program = CreateComputeProgram(GenC(expected_value));
		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s.\n", i, ToString(map_data[i]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str());
				glDeleteTextures(2, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteProgram(c_program);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glDeleteTextures(2, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(c_program);
		glDeleteBuffers(1, &m_buffer);

		return true;
	}